

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pushdown_inner_join.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::FilterPushdown::PushdownInnerJoin
          (FilterPushdown *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op,unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *left_bindings,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *right_bindings)

{
  pointer pLVar1;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var2;
  FilterResult FVar3;
  pointer pLVar4;
  pointer pLVar5;
  LogicalAnyJoin *pLVar6;
  LogicalEmptyResult *pLVar7;
  reference pvVar8;
  reference pvVar9;
  LogicalCrossProduct *this_00;
  LogicalOperator *this_01;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var10;
  pointer pLVar11;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> condition;
  templated_unique_single_t cross_product;
  undefined1 local_88 [16];
  _Head_base<0UL,_duckdb::LogicalCrossProduct_*,_false> local_78;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_70;
  LogicalCrossProduct *local_68;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_60;
  __buckets_ptr local_58;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_50;
  JoinCondition local_48;
  
  pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       *)left_bindings);
  pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       *)left_bindings);
  if (pLVar5->type == LOGICAL_DELIM_JOIN) {
    local_58 = (left_bindings->_M_h)._M_buckets;
    (left_bindings->_M_h)._M_buckets = (__buckets_ptr)0x0;
    FinishPushdown(this,op);
    if (local_58 != (__buckets_ptr)0x0) {
      (*(code *)(*local_58)[1]._M_nxt)();
    }
  }
  else {
    pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)left_bindings);
    local_50._M_head_impl = (LogicalOperator *)this;
    if (pLVar5->type == LOGICAL_ANY_JOIN) {
      pLVar6 = LogicalOperator::Cast<duckdb::LogicalAnyJoin>(pLVar4);
      local_60._M_head_impl =
           (pLVar6->condition).
           super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (pLVar6->condition).
      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      FVar3 = AddFilter((FilterPushdown *)op,
                        (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)&local_60);
      if (local_60._M_head_impl != (Expression *)0x0) {
        (*((local_60._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_60._M_head_impl = (Expression *)0x0;
      if (FVar3 == UNSATISFIABLE) {
        pLVar7 = (LogicalEmptyResult *)operator_new(0x98);
        local_88._8_8_ = (left_bindings->_M_h)._M_buckets;
        (left_bindings->_M_h)._M_buckets = (__buckets_ptr)0x0;
        LogicalEmptyResult::LogicalEmptyResult
                  (pLVar7,(unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)(local_88 + 8));
        _Var2._M_head_impl = local_50._M_head_impl;
        if ((tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)local_88._8_8_ !=
            (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
          (*(code *)(*(__buckets_ptr)local_88._8_8_)[1]._M_nxt)();
        }
        (_Var2._M_head_impl)->_vptr_LogicalOperator = (_func_int **)pLVar7;
        return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                )_Var2._M_head_impl;
      }
    }
    else {
      pLVar1 = (pointer)pLVar4[1].estimated_cardinality;
      for (pLVar11 = pLVar4[1].types.
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage; pLVar11 != pLVar1;
          pLVar11 = pLVar11 + 1) {
        local_48.left.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
        ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             *(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)pLVar11;
        pLVar11->id_ = INVALID;
        pLVar11->physical_type_ = ~INVALID;
        *(undefined6 *)&pLVar11->field_0x2 = 0;
        local_48.right.
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (pLVar11->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (pLVar11->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_48.comparison =
             *(ExpressionType *)
              &(pLVar11->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
        JoinCondition::CreateExpression((JoinCondition *)local_88,&local_48);
        if (local_48.right.
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
             )0x0) {
          (*(*(_func_int ***)
              local_48.right.
              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
              _M_t.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)[1])();
        }
        local_48.right.
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
              )0x0;
        if (local_48.left.
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)local_48.left.
                                super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8
                      ))();
        }
        local_48.left.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
        ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
              )0x0;
        local_70._M_head_impl = (Expression *)local_88._0_8_;
        local_88._0_8_ = (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
        FVar3 = AddFilter((FilterPushdown *)op,
                          (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)&local_70);
        if (local_70._M_head_impl != (Expression *)0x0) {
          (*((local_70._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_70._M_head_impl = (Expression *)0x0;
        if (FVar3 == UNSATISFIABLE) {
          pLVar7 = (LogicalEmptyResult *)operator_new(0x98);
          local_88._8_8_ = (left_bindings->_M_h)._M_buckets;
          (left_bindings->_M_h)._M_buckets = (__buckets_ptr)0x0;
          LogicalEmptyResult::LogicalEmptyResult
                    (pLVar7,(unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)(local_88 + 8));
          this = (FilterPushdown *)local_50;
          if ((LogicalOperator *)local_88._8_8_ != (LogicalOperator *)0x0) {
            (*((BaseExpression *)local_88._8_8_)->_vptr_BaseExpression[1])();
          }
          *(LogicalEmptyResult **)this = pLVar7;
          _Var10._M_head_impl = (Expression *)local_88._0_8_;
          goto LAB_00d356c3;
        }
        if ((Expression *)local_88._0_8_ != (Expression *)0x0) {
          (*((BaseExpression *)local_88._0_8_)->_vptr_BaseExpression[1])();
        }
      }
    }
    GenerateFilters((FilterPushdown *)op);
    pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)left_bindings);
    pvVar8 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::operator[](&pLVar4->children,0);
    pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)left_bindings);
    pvVar9 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::operator[](&pLVar4->children,1);
    this_00 = (LogicalCrossProduct *)operator_new(0x68);
    local_88._8_8_ =
         (pvVar8->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (pvVar8->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    local_88._0_8_ =
         (pvVar9->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (pvVar9->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    LogicalCrossProduct::LogicalCrossProduct
              (this_00,(unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                        *)(local_88 + 8),
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)local_88);
    this = (FilterPushdown *)local_50;
    local_78._M_head_impl = this_00;
    if ((tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)local_88._0_8_ !=
        (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
      (*(*(_func_int ***)local_88._0_8_)[1])();
    }
    local_88._0_8_ =
         (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
    if ((LogicalOperator *)local_88._8_8_ != (LogicalOperator *)0x0) {
      (*((BaseExpression *)local_88._8_8_)->_vptr_BaseExpression[1])();
    }
    pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)left_bindings);
    if (pLVar4->has_estimated_cardinality == true) {
      this_01 = (LogicalOperator *)
                unique_ptr<duckdb::LogicalCrossProduct,_std::default_delete<duckdb::LogicalCrossProduct>,_true>
                ::operator->((unique_ptr<duckdb::LogicalCrossProduct,_std::default_delete<duckdb::LogicalCrossProduct>,_true>
                              *)&local_78);
      pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)left_bindings);
      LogicalOperator::SetEstimatedCardinality(this_01,pLVar4->estimated_cardinality);
    }
    local_68 = local_78._M_head_impl;
    local_78._M_head_impl = (LogicalCrossProduct *)0x0;
    PushdownCrossProduct(this,op);
    if (local_68 != (LogicalCrossProduct *)0x0) {
      (*(local_68->super_LogicalUnconditionalJoin).super_LogicalOperator._vptr_LogicalOperator[1])()
      ;
    }
    local_68 = (LogicalCrossProduct *)0x0;
    _Var10._M_head_impl = (Expression *)local_78._M_head_impl;
LAB_00d356c3:
    if (_Var10._M_head_impl != (Expression *)0x0) {
      (*((_Var10._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         )this;
}

Assistant:

unique_ptr<LogicalOperator> FilterPushdown::PushdownInnerJoin(unique_ptr<LogicalOperator> op,
                                                              unordered_set<idx_t> &left_bindings,
                                                              unordered_set<idx_t> &right_bindings) {
	auto &join = op->Cast<LogicalJoin>();
	D_ASSERT(join.join_type == JoinType::INNER);
	if (op->type == LogicalOperatorType::LOGICAL_DELIM_JOIN) {
		return FinishPushdown(std::move(op));
	}
	// inner join: gather all the conditions of the inner join and add to the filter list
	if (op->type == LogicalOperatorType::LOGICAL_ANY_JOIN) {
		auto &any_join = join.Cast<LogicalAnyJoin>();
		// any join: only one filter to add
		if (AddFilter(std::move(any_join.condition)) == FilterResult::UNSATISFIABLE) {
			// filter statically evaluates to false, strip tree
			return make_uniq<LogicalEmptyResult>(std::move(op));
		}
	} else {
		// comparison join
		D_ASSERT(op->type == LogicalOperatorType::LOGICAL_COMPARISON_JOIN);
		auto &comp_join = join.Cast<LogicalComparisonJoin>();
		// turn the conditions into filters
		for (auto &i : comp_join.conditions) {
			auto condition = JoinCondition::CreateExpression(std::move(i));
			if (AddFilter(std::move(condition)) == FilterResult::UNSATISFIABLE) {
				// filter statically evaluates to false, strip tree
				return make_uniq<LogicalEmptyResult>(std::move(op));
			}
		}
	}
	GenerateFilters();

	// turn the inner join into a cross product
	auto cross_product = make_uniq<LogicalCrossProduct>(std::move(op->children[0]), std::move(op->children[1]));

	// preserve the estimated cardinality of the operator
	if (op->has_estimated_cardinality) {
		cross_product->SetEstimatedCardinality(op->estimated_cardinality);
	}

	// then push down cross product
	return PushdownCrossProduct(std::move(cross_product));
}